

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2Adr(MCInst *Inst,uint32_t Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int32_t iVar5;
  uint sign2;
  uint sign1;
  uint Val;
  void *Decoder_local;
  uint64_t Address_local;
  uint32_t Insn_local;
  MCInst *Inst_local;
  
  uVar1 = fieldFromInstruction_4(Insn,0x15,1);
  uVar2 = fieldFromInstruction_4(Insn,0x17,1);
  if (uVar1 == uVar2) {
    uVar2 = fieldFromInstruction_4(Insn,0,8);
    uVar3 = fieldFromInstruction_4(Insn,0xc,3);
    uVar4 = fieldFromInstruction_4(Insn,0x1a,1);
    iVar5 = SignExtend32(uVar1 << 0xc | uVar4 << 0xb | uVar3 << 8 | uVar2,0xd);
    MCOperand_CreateImm0(Inst,(long)iVar5);
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2Adr(MCInst *Inst, uint32_t Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned Val;
	unsigned sign1 = fieldFromInstruction_4(Insn, 21, 1);
	unsigned sign2 = fieldFromInstruction_4(Insn, 23, 1);
	if (sign1 != sign2) return MCDisassembler_Fail;

	Val = fieldFromInstruction_4(Insn, 0, 8);
	Val |= fieldFromInstruction_4(Insn, 12, 3) << 8;
	Val |= fieldFromInstruction_4(Insn, 26, 1) << 11;
	Val |= sign1 << 12;
	MCOperand_CreateImm0(Inst, SignExtend32(Val, 13));

	return MCDisassembler_Success;
}